

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::SocketAcceptor::onInitialize(SocketAcceptor *this,SessionSettings *sessionSettings)

{
  bool bVar1;
  mapped_type_conflict1 mVar2;
  uint uVar3;
  SocketServer *this_00;
  Dictionary *pDVar4;
  mapped_type *this_01;
  mapped_type_conflict1 *pmVar5;
  int local_3b0;
  int local_378;
  bool local_342;
  bool local_312;
  SocketException *e;
  key_type_conflict1 local_1f2;
  socket_handle local_1f0;
  byte local_1eb;
  byte local_1ea;
  allocator<char> local_1e9;
  socket_handle acceptSocket;
  allocator<char> local_1c1;
  string local_1c0;
  int local_1a0;
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  int rcvBufSize;
  allocator<char> local_171;
  string local_170;
  int local_150;
  byte local_14b;
  byte local_14a;
  allocator<char> local_149;
  int sendBufSize;
  allocator<char> local_121;
  string local_120;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  allocator<char> local_f9;
  undefined1 local_f8 [4];
  bool noDelay;
  allocator<char> local_d1;
  string local_d0;
  byte local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [6];
  bool reuseAddress;
  Dictionary *local_88;
  Dictionary *settings;
  SessionID *sessionID;
  iterator __end2;
  iterator __begin2;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *__range2;
  uint16_t port;
  SessionSettings *sessionSettings_local;
  SocketAcceptor *this_local;
  
  this_00 = (SocketServer *)operator_new(0x160);
  SocketServer::SocketServer(this_00,1);
  this->m_pServer = this_00;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin2,sessionSettings);
  __end2 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 &__begin2);
  sessionID = (SessionID *)
              std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
              end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )&__begin2);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&sessionID), bVar1) {
    settings = (Dictionary *)std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&__end2);
    pDVar4 = SessionSettings::get(sessionSettings,(SessionID *)settings);
    local_88 = pDVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"SocketAcceptPort",&local_a9);
    uVar3 = Dictionary::getInt(pDVar4,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator(&local_a9);
    pDVar4 = local_88;
    std::allocator<char>::allocator();
    local_fa = 0;
    local_fb = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"SocketReuseAddress",&local_d1);
    bVar1 = Dictionary::has(pDVar4,&local_d0);
    pDVar4 = local_88;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_fa = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"SocketReuseAddress",&local_f9);
      local_fb = 1;
      local_312 = Dictionary::getBool(pDVar4,(string *)local_f8);
    }
    else {
      local_312 = true;
    }
    if ((local_fb & 1) != 0) {
      std::__cxx11::string::~string((string *)local_f8);
    }
    if ((local_fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_f9);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    pDVar4 = local_88;
    local_aa = local_312;
    std::allocator<char>::allocator();
    local_14a = 0;
    local_14b = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"SocketNodelay",&local_121);
    bVar1 = Dictionary::has(pDVar4,&local_120);
    pDVar4 = local_88;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_14a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sendBufSize,"SocketNodelay",&local_149);
      local_14b = 1;
      local_342 = Dictionary::getBool(pDVar4,(string *)&sendBufSize);
    }
    else {
      local_342 = false;
    }
    if ((local_14b & 1) != 0) {
      std::__cxx11::string::~string((string *)&sendBufSize);
    }
    if ((local_14a & 1) != 0) {
      std::allocator<char>::~allocator(&local_149);
    }
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    pDVar4 = local_88;
    local_fc = local_342;
    std::allocator<char>::allocator();
    local_19a = 0;
    local_19b = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"SocketSendBufferSize",&local_171);
    bVar1 = Dictionary::has(pDVar4,&local_170);
    pDVar4 = local_88;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_19a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rcvBufSize,"SocketSendBufferSize",&local_199);
      local_19b = 1;
      local_378 = Dictionary::getInt(pDVar4,(string *)&rcvBufSize);
    }
    else {
      local_378 = 0;
    }
    if ((local_19b & 1) != 0) {
      std::__cxx11::string::~string((string *)&rcvBufSize);
    }
    if ((local_19a & 1) != 0) {
      std::allocator<char>::~allocator(&local_199);
    }
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    pDVar4 = local_88;
    local_150 = local_378;
    std::allocator<char>::allocator();
    local_1ea = 0;
    local_1eb = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"SocketReceiveBufferSize",&local_1c1);
    bVar1 = Dictionary::has(pDVar4,&local_1c0);
    pDVar4 = local_88;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_1ea = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&acceptSocket,"SocketReceiveBufferSize",&local_1e9);
      local_1eb = 1;
      local_3b0 = Dictionary::getInt(pDVar4,(string *)&acceptSocket);
    }
    else {
      local_3b0 = 0;
    }
    if ((local_1eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&acceptSocket);
    }
    if ((local_1ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_1e9);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    local_1a0 = local_3b0;
    local_1f0 = SocketServer::add(this->m_pServer,uVar3 & 0xffff,(bool)(local_aa & 1),
                                  (bool)(local_fc & 1),local_150,local_3b0);
    local_1f2 = socket_hostport(local_1f0);
    this_01 = std::
              map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
              ::operator[](&this->m_portToSessions,&local_1f2);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::insert
              (this_01,(value_type *)settings);
    mVar2 = socket_hostport(local_1f0);
    pmVar5 = std::
             map<FIX::SessionID,_unsigned_short,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
             ::operator[](&this->m_sessionToPort,(key_type *)settings);
    *pmVar5 = mVar2;
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&__end2);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin2);
  return;
}

Assistant:

EXCEPT(RuntimeError) {
  uint16_t port = 0;

  try {
    m_pServer = new SocketServer(1);

    for (const SessionID &sessionID : sessionSettings.getSessions()) {
      const Dictionary &settings = sessionSettings.get(sessionID);
      port = (short)settings.getInt(SOCKET_ACCEPT_PORT);

      const bool reuseAddress = settings.has(SOCKET_REUSE_ADDRESS) ? settings.getBool(SOCKET_REUSE_ADDRESS) : true;

      const bool noDelay = settings.has(SOCKET_NODELAY) ? settings.getBool(SOCKET_NODELAY) : false;

      const int sendBufSize = settings.has(SOCKET_SEND_BUFFER_SIZE) ? settings.getInt(SOCKET_SEND_BUFFER_SIZE) : 0;

      const int rcvBufSize = settings.has(SOCKET_RECEIVE_BUFFER_SIZE) ? settings.getInt(SOCKET_RECEIVE_BUFFER_SIZE) : 0;

      socket_handle acceptSocket = m_pServer->add(port, reuseAddress, noDelay, sendBufSize, rcvBufSize);
      m_portToSessions[socket_hostport(acceptSocket)].insert(sessionID);
      m_sessionToPort[sessionID] = socket_hostport(acceptSocket);
    }
  } catch (SocketException &e) {
    delete m_pServer;
    m_pServer = 0;
    throw RuntimeError(
        "Unable to create, bind, or listen to port " + IntConvertor::convert((unsigned short)port) + " (" + e.what()
        + ")");
  }
}